

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest6::iterate(FunctionalTest6 *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  RenderContext *pRVar4;
  long lVar5;
  TestError *this_02;
  TestContext *pTVar6;
  TestLog *pTVar7;
  MessageBuilder *this_03;
  socklen_t __len;
  sockaddr *__addr;
  socklen_t __fd;
  double __x;
  double __x_00;
  double __x_01;
  undefined1 local_3b8 [8];
  MessageBuilder message;
  undefined1 local_b8 [8];
  vec4<float> result;
  GLfloat *feedback_data;
  GLint uniform_location;
  Functions *gl;
  vertexArray vao;
  buffer transform_feedback_buffer;
  program program;
  string local_40;
  FunctionalTest6 *local_10;
  FunctionalTest6 *this_local;
  undefined4 extraout_var;
  
  local_10 = this;
  if (iterate()::input_data == '\0') {
    iVar2 = __cxa_guard_acquire(&iterate()::input_data);
    if (iVar2 != 0) {
      Utils::vec4<float>::vec4(&iterate::input_data,1.0,4.0,9.0,16.0);
      __cxa_guard_release(&iterate()::input_data);
    }
  }
  if (iterate()::expected_result == '\0') {
    iVar2 = __cxa_guard_acquire(&iterate()::expected_result);
    if (iVar2 != 0) {
      Utils::vec4<float>::vec4(&iterate::expected_result,1.0,16.0,81.0,256.0);
      __cxa_guard_release(&iterate()::expected_result);
    }
  }
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    program.m_context._6_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_ARB_shader_subroutine is not supported.",
               (allocator<char> *)((long)&program.m_context + 7));
    tcu::NotSupportedError::NotSupportedError(this_01,&local_40);
    program.m_context._6_1_ = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  Utils::program::program
            ((program *)&transform_feedback_buffer.m_context,(this->super_TestCase).m_context);
  Utils::buffer::buffer((buffer *)&vao.m_context,(this->super_TestCase).m_context);
  Utils::vertexArray::vertexArray((vertexArray *)&gl,(this->super_TestCase).m_context);
  __len = 0;
  __fd = __len;
  Utils::program::build
            ((program *)&transform_feedback_buffer.m_context,(GLchar *)0x0,(GLchar *)0x0,
             (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,iterate::vertex_shader_code,
             &iterate::varying_name,1,false);
  Utils::program::use((program *)&transform_feedback_buffer.m_context);
  Utils::vertexArray::generate((vertexArray *)&gl);
  Utils::vertexArray::bind((vertexArray *)&gl,__fd,__addr,__len);
  Utils::buffer::generate((buffer *)&vao.m_context);
  Utils::buffer::update((buffer *)&vao.m_context,0x8c8e,0x10,(GLvoid *)0x0,0x88ea);
  Utils::buffer::bindRange((buffer *)&vao.m_context,0x8c8e,0,0,0x10);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  iVar2 = (**(code **)(lVar5 + 0xb48))(program.m_fragment_shader_id,"input_data");
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x10e3);
  if (iVar2 == -1) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Uniform is not available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x10e7);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar5 + 0x15a0))
            (iterate::input_data.m_x,iterate::input_data.m_y,iterate::input_data.m_z,
             iterate::input_data.m_w,iVar2);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x10ec);
  (**(code **)(lVar5 + 0x30))(0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x10f0);
  (**(code **)(lVar5 + 0x538))(0,0,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x10f3);
  (**(code **)(lVar5 + 0x638))();
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x10f6);
  result._8_8_ = (**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x10fa);
  Utils::vec4<float>::vec4
            ((vec4<float> *)local_b8,*(float *)result._8_8_,*(float *)(result._8_8_ + 4),
             *(float *)(result._8_8_ + 8),*(float *)(result._8_8_ + 0xc));
  (**(code **)(lVar5 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x10ff);
  bVar1 = Utils::vec4<float>::operator==(&iterate::expected_result,(vec4<float> *)local_b8);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar7 = tcu::TestContext::getLog(pTVar6);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&message.m_str.field_0x170,pTVar7,
               (BeginMessageToken *)&tcu::TestLog::Message);
    this_03 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&message.m_str.field_0x170,
                         (char (*) [23])"Error. Invalid result.");
    tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&message.m_str.field_0x170);
    pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar7 = tcu::TestContext::getLog(pTVar6);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_3b8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<((MessageBuilder *)local_3b8,(char (*) [19])"Function: square( ")
    ;
    Utils::vec4<float>::log(&iterate::input_data,__x);
    tcu::MessageBuilder::operator<<((MessageBuilder *)local_3b8,(char (*) [13])" ). Result: ");
    Utils::vec4<float>::log((vec4<float> *)local_b8,__x_00);
    tcu::MessageBuilder::operator<<((MessageBuilder *)local_3b8,(char (*) [13])0x2b4545a);
    Utils::vec4<float>::log(&iterate::expected_result,__x_01);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3b8);
  }
  Utils::vertexArray::~vertexArray((vertexArray *)&gl);
  Utils::buffer::~buffer((buffer *)&vao.m_context);
  Utils::program::~program((program *)&transform_feedback_buffer.m_context);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest6::iterate()
{
	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "// Subroutine type\n"
											  "subroutine vec4 routine_type(in vec4 iparam);\n"
											  "\n"
											  "// Subroutine definition\n"
											  "subroutine(routine_type) vec4 square(in vec4 iparam)\n"
											  "{\n"
											  "    return iparam * iparam;\n"
											  "}\n"
											  "\n"
											  "// Sub routine uniform\n"
											  "subroutine uniform routine_type routine;\n"
											  "\n"
											  "// Input data\n"
											  "uniform vec4 input_data;\n"
											  "\n"
											  "// Output\n"
											  "out  vec4 out_result;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    out_result  = square(input_data);\n"
											  "}\n"
											  "\n";

	static const GLchar* varying_name = "out_result";

	/* Test data */
	static const Utils::vec4<GLfloat> input_data(1.0f, 4.0f, 9.0f, 16.0f);

	static const Utils::vec4<GLfloat> expected_result(1.0f, 16.0f, 81.0f, 256.0f);

	static const GLuint transform_feedback_buffer_size = 4 * sizeof(GLfloat);

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code, &varying_name,
				  1 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();
	transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
									 GL_DYNAMIC_COPY);
	transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

	/* Test */
	{
		const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
		const GLint			  uniform_location = gl.getUniformLocation(program.m_program_object_id, "input_data");

		GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

		if (-1 == uniform_location)
		{
			TCU_FAIL("Uniform is not available");
		}

		/* Set up input data uniforms */
		gl.uniform4f(uniform_location, input_data.m_x, input_data.m_y, input_data.m_z, input_data.m_w);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

		/* Execute draw call with transform feedback */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

		/* Capture results */
		GLfloat* feedback_data = (GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

		Utils::vec4<GLfloat> result(feedback_data[0], feedback_data[1], feedback_data[2], feedback_data[3]);

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

		/* Verify */
		if (expected_result == result)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
												<< tcu::TestLog::EndMessage;

			tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Function: square( ";
			input_data.log(message);
			message << " ). Result: ";
			result.log(message);
			message << ". Expected: ";
			expected_result.log(message);

			message << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	/* Done */
	return tcu::TestNode::STOP;
}